

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * __thiscall
LowererMD::ChangeToHelperCall
          (LowererMD *this,Instr *callInstr,JnHelperMethod helperMethod,LabelInstr *labelBailOut,
          Opnd *opndBailOutArg,PropertySymOpnd *propSymOpnd,bool isHelperContinuation)

{
  uint32 bailOutOffset;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BailOutKind BVar4;
  uint uVar5;
  uint functionId;
  undefined4 *puVar6;
  HelperCallOpnd *this_00;
  Var address;
  AddrOpnd *opndArg;
  Instr *pIVar7;
  BailOutInfo *pBVar8;
  BailOutRecord *this_01;
  BailOutInfo *local_48;
  Instr *local_38;
  Instr *callInstr_local;
  
  local_38 = callInstr;
  bVar2 = IR::Instr::HasLazyBailOut(callInstr);
  if ((bVar2) && (bVar2 = HelperMethodAttributes::CanBeReentrant(helperMethod), !bVar2)) {
    IR::Instr::ClearLazyBailOut(callInstr);
  }
  bVar2 = IR::Instr::HasLazyBailOut(callInstr);
  if (((bVar2) && (bVar2 = IR::Instr::HasPreOpBailOut(callInstr), bVar2)) &&
     (BVar4 = IR::Instr::GetBailOutKind(callInstr),
     (BVar4 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x2c0,"(false)","Not implemented");
    if (!bVar2) goto LAB_005d4a63;
    *puVar6 = 0;
  }
  bVar2 = IR::Instr::HasLazyBailOut(callInstr);
  if ((callInstr->field_0x38 & 0x10) == 0) {
    local_48 = (BailOutInfo *)0x0;
  }
  else {
    local_48 = IR::Instr::GetBailOutInfo(callInstr);
  }
  Lowerer::ReconcileWithLowererStateOnHelperCall(this->m_lowerer,callInstr,helperMethod);
  pIVar7 = callInstr;
  if ((callInstr->field_0x38 & 0x10) != 0) {
    BVar4 = IR::Instr::GetBailOutKind(callInstr);
    if ((BVar4 == BailOutOnPowIntIntOverflow) || (BVar4 == BailOutOnNotPrimitive)) {
      pIVar7 = IR::Instr::New(callInstr->m_opcode,callInstr->m_func);
      local_38 = pIVar7;
      IR::Instr::TransferTo(callInstr,pIVar7);
      IR::Instr::InsertBefore(callInstr,pIVar7);
      callInstr->m_opcode = BVar4 == BailOutOnNotPrimitive ^ BailOnPowIntIntOverflow;
      IR::Instr::SetSrc1(callInstr,opndBailOutArg);
    }
    else if ((BVar4 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
      callInstr = Lowerer::SplitBailOnImplicitCall(this->m_lowerer,&local_38);
      pIVar7 = local_38;
    }
    else if (-1 < (int)BVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x2e2,"(BailOutInfo::HasLazyBailOut(bailOutKind))",
                         "Unexpected BailOutKind, are we adding new BailOutKind on instructions?");
      if (!bVar3) goto LAB_005d4a63;
      *puVar6 = 0;
    }
  }
  pIVar7->m_opcode = CALL;
  this_00 = Lowerer::CreateHelperCallOpnd
                      (helperMethod,(this->lowererMDArch).helperCallArgsCount,this->m_func);
  bVar3 = IR::HelperCallOpnd::IsDiagHelperCallOpnd(this_00);
  pIVar7 = local_38;
  if (bVar3) {
    address = (Var)IR::GetMethodOriginalAddress(this->m_func->m_threadContextInfo,helperMethod);
    opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
    LowererMDArch::LoadHelperArgument(&this->lowererMDArch,pIVar7,&opndArg->super_Opnd);
    Lowerer::LoadScriptContext(this->m_lowerer,local_38);
  }
  IR::Instr::SetSrc1(local_38,&this_00->super_Opnd);
  pIVar7 = LowererMDArch::LowerCall(&this->lowererMDArch,local_38,0);
  if (callInstr != local_38) {
    if ((callInstr->m_opcode & ~ExtendedOpcodePrefix) == BailOnNotPrimitive) {
      Lowerer::LowerBailOnTrue(this->m_lowerer,callInstr,labelBailOut);
    }
    else if (callInstr->m_opcode == BailOnNotEqual) {
      BVar4 = IR::Instr::GetBailOutKind(callInstr);
      if ((BVar4 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x300,
                           "(BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind()))"
                           ,"BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind())")
        ;
        if (!bVar3) goto LAB_005d4a63;
        *puVar6 = 0;
      }
      Lowerer::LowerBailOnEqualOrNotEqual
                (this->m_lowerer,callInstr,(BranchInstr *)0x0,labelBailOut,propSymOpnd,
                 isHelperContinuation);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x305,"(false)","Unexpected OpCode for BailOutInstruction");
      if (!bVar3) goto LAB_005d4a63;
      *puVar6 = 0;
    }
    if (!bVar2) goto LAB_005d49ba;
    if (local_48 == (BailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x319,"(bailOutInfo != nullptr)","bailOutInfo != nullptr");
      if (!bVar2) goto LAB_005d4a63;
      *puVar6 = 0;
    }
    if ((local_38->field_0x38 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x31a,"(!callInstr->HasBailOutInfo())","!callInstr->HasBailOutInfo()");
      if (!bVar2) goto LAB_005d4a63;
      *puVar6 = 0;
    }
    if (local_38->m_opcode != CALL) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x31b,"(callInstr->m_opcode == Js::OpCode::CALL)",
                         "callInstr->m_opcode == Js::OpCode::CALL");
      if (!bVar2) goto LAB_005d4a63;
      *puVar6 = 0;
    }
    local_38 = IR::Instr::ConvertToBailOutInstrWithBailOutInfoCopy(local_38,local_48,LazyBailOut);
    if (((local_38->field_0x38 & 0x10) == 0) ||
       (pBVar8 = IR::Instr::GetBailOutInfo(local_38), pBVar8 == local_48)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,799,
                         "(callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo)"
                         ,
                         "callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo"
                        );
      if (!bVar2) {
LAB_005d4a63:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    pBVar8 = IR::Instr::GetBailOutInfo(local_38);
    this_01 = (BailOutRecord *)
              new<NativeCodeData::AllocatorT<BailOutRecord>>
                        (0x60,(AllocatorT<BailOutRecord> *)
                              &this->m_func->topFunc->nativeCodeDataAllocator,0x53aad2);
    bailOutOffset = pBVar8->bailOutOffset;
    uVar5 = pBVar8->polymorphicCacheIndex;
    BVar4 = IR::Instr::GetBailOutKind(local_38);
    BailOutRecord::BailOutRecord(this_01,bailOutOffset,uVar5,BVar4,pBVar8->bailOutFunc);
    this_01->bailOutOpcode = pBVar8->bailOutOpcode;
    pBVar8->bailOutRecord = this_01;
  }
LAB_005d49ba:
  uVar5 = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01447bf0,AsmjsCallDebugBreakPhase,uVar5,functionId);
  if (bVar2) {
    GenerateDebugBreak(pIVar7->m_next);
  }
  return pIVar7;
}

Assistant:

IR::Instr *
LowererMD::ChangeToHelperCall(IR::Instr *callInstr, IR::JnHelperMethod helperMethod, IR::LabelInstr *labelBailOut,
                              IR::Opnd *opndBailOutArg, IR::PropertySymOpnd *propSymOpnd, bool isHelperContinuation)
{
    // Clear lazy bailout when we realize that the function cannot be reentrant in lowerer
    // since they won't have side effects
    if (callInstr->HasLazyBailOut() && !HelperMethodAttributes::CanBeReentrant(helperMethod))
    {
        callInstr->ClearLazyBailOut();
    }

    // If we want a LazyBailOut on an instruction with preop bailout, we
    // would need to have a BailOnImplicitCallPreOp on that instruction.
    // There are two ways we can go about this:
    // 1. During GlobOpt::GenerateLazyBailOut, simply use BailOnImplicitCallPreOp
    //    as the main bailout kind for that instruction. This wouldn't require
    //    any special treatment in the lowerer. However, there are a few problems:
    //      a) The instruction might have some other main bailout kind already
    //         attached.
    //         + First scenario is that the bailout kind already prevents
    //         implicit calls from happening, which leaves us to just correctly
    //         implement GlobOpt::IsLazyBailOutCurrentlyNeeded so that it doesn't
    //         return true when we already have such bailouts by incorporating
    //         GlobOpt::MayNeedBailOnImplicitCall.
    //         + Second scenario is when that bailout kind doesn't really help with
    //         preventing implicit calls. Theoretically, this shouldn't be a problem
    //         because we should be able to support bail on implicit calls if that
    //         instruction might have implicit calls. But there are some dark patterns
    //         such as NewScObjArray having a BailOnNotNative attached to it.
    //         Those will need to be rewritten before we proceed.
    // 
    //      b) We will have to change our BailOutKind bit validation because some of the
    //         kinds don't currently expect to go together with BailOnImplicitCall. This
    //         is probably less of a problem and more of just finding those cases and
    //         adding allowed bit combinations.
    //
    // 2. Just attach the lazy bailout bit onto the BailOutKind and use this opportunity
    //    to also lower an additional BailOnImplicitCallPreOp. The problem is we aren't
    //    sure if those instructions will go through `ChangeToHelperCall` at all since
    //    this right now only handles BailOutOnNotPrimitive, BailOutOnPowIntIntOverflow,
    //    and BailOutOnImplicitCalls.
    if (callInstr->HasLazyBailOut() && callInstr->HasPreOpBailOut() &&
        !BailOutInfo::IsBailOutOnImplicitCalls(callInstr->GetBailOutKind()))
    {
        AssertMsg(false, "Not implemented");
    }

    const bool hasLazyBailOut = callInstr->HasLazyBailOut();

    // Cache BailOutInfo so that we can copy it later for lazy bailout
    BailOutInfo * const bailOutInfo = callInstr->HasBailOutInfo() ? callInstr->GetBailOutInfo() : nullptr;

#if DBG
    this->m_lowerer->ReconcileWithLowererStateOnHelperCall(callInstr, helperMethod);
#endif
    IR::Instr * bailOutInstr = callInstr;
    if (callInstr->HasBailOutInfo())
    {
        const IR::BailOutKind bailOutKind = callInstr->GetBailOutKind();

        if (bailOutKind == IR::BailOutOnNotPrimitive ||
            bailOutKind == IR::BailOutOnPowIntIntOverflow)
        {
            callInstr = IR::Instr::New(callInstr->m_opcode, callInstr->m_func);
            bailOutInstr->TransferTo(callInstr);
            bailOutInstr->InsertBefore(callInstr);

            bailOutInstr->m_opcode = bailOutKind == IR::BailOutOnNotPrimitive
                                        ? Js::OpCode::BailOnNotPrimitive
                                        : Js::OpCode::BailOnPowIntIntOverflow;
            bailOutInstr->SetSrc1(opndBailOutArg);
        }
        else if (BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
        {
            bailOutInstr = this->m_lowerer->SplitBailOnImplicitCall(callInstr);
        }
        else
        {
            AssertMsg(BailOutInfo::HasLazyBailOut(bailOutKind), "Unexpected BailOutKind, are we adding new BailOutKind on instructions?");
        }
    }

    callInstr->m_opcode = Js::OpCode::CALL;

    IR::HelperCallOpnd *helperCallOpnd = Lowerer::CreateHelperCallOpnd(helperMethod, this->lowererMDArch.GetHelperArgsCount(), m_func);
    if (helperCallOpnd->IsDiagHelperCallOpnd())
    {
        // Load arguments for the wrapper.
        this->LoadHelperArgument(callInstr, IR::AddrOpnd::New((Js::Var)IR::GetMethodOriginalAddress(m_func->GetThreadContextInfo(), helperMethod), IR::AddrOpndKindDynamicMisc, m_func));
        this->m_lowerer->LoadScriptContext(callInstr);
    }
    callInstr->SetSrc1(helperCallOpnd);

    IR::Instr * instrRet = this->lowererMDArch.LowerCall(callInstr, 0);

    if (bailOutInstr != callInstr)
    {
        const Js::OpCode opcode = bailOutInstr->m_opcode;
        // The bailout needs to be lowered after we lower the helper call because the helper argument
        // has already been loaded. We need to drain them on AMD64 before starting another helper call
        if (opcode == Js::OpCode::BailOnNotPrimitive ||
            opcode == Js::OpCode::BailOnPowIntIntOverflow)
        {
            this->m_lowerer->LowerBailOnTrue(bailOutInstr, labelBailOut);
        }
        else if (opcode == Js::OpCode::BailOnNotEqual)
        {
            // `SplitBailOnImplicitCall` above changes the opcode to BailOnNotEqual
            Assert(BailOutInfo::IsBailOutOnImplicitCalls(bailOutInstr->GetBailOutKind()));
            this->m_lowerer->LowerBailOnEqualOrNotEqual(bailOutInstr, nullptr, labelBailOut, propSymOpnd, isHelperContinuation);
        }
        else
        {
            AssertMsg(false, "Unexpected OpCode for BailOutInstruction");
        }

        // Create BailOutInfo and BailOutRecord for helper call
        // Example:
        // We transform:
        // ```
        //  call someHelper
        //  ...
        //  call SaveAllRegisterAndBailOut (BailOutReason)
        // ```
        // to
        // ```
        //  call someHelper (LazyBailOut)
        //  ...
        //  call SaveAllRegisterAndBailOut (BailOutReason)
        // ```
        // so that the call to helper has the correct BailOutRecord filled during RegAlloc.
        if (hasLazyBailOut)
        {
            Assert(bailOutInfo != nullptr);
            Assert(!callInstr->HasBailOutInfo());
            Assert(callInstr->m_opcode == Js::OpCode::CALL);

            callInstr = callInstr->ConvertToBailOutInstrWithBailOutInfoCopy(bailOutInfo, IR::LazyBailOut);

            Assert(callInstr->HasBailOutInfo() && callInstr->GetBailOutInfo() != bailOutInfo);

            BailOutInfo *bailOutInfoCopy = callInstr->GetBailOutInfo();

            BailOutRecord *bailOutRecord = NativeCodeDataNewZ(
                this->m_func->GetNativeCodeDataAllocator(),
                BailOutRecord,
                bailOutInfoCopy->bailOutOffset,
                bailOutInfoCopy->polymorphicCacheIndex,
                callInstr->GetBailOutKind(),
                bailOutInfoCopy->bailOutFunc
            );

#if ENABLE_DEBUG_CONFIG_OPTIONS
            bailOutRecord->bailOutOpcode = bailOutInfoCopy->bailOutOpcode;
#endif

            bailOutInfoCopy->bailOutRecord = bailOutRecord;
        }
    }

#if DBG
    if (PHASE_ON(Js::AsmjsCallDebugBreakPhase, this->m_func))
    {
        this->GenerateDebugBreak(instrRet->m_next);
    }
#endif

    return instrRet;
}